

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O1

void phmap::priv::
     BucketCountAllocTest<phmap::parallel_flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>>
               (void)

{
  size_t sz;
  long lVar1;
  long lVar2;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  A alloc;
  parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
  m;
  AssertHelper local_4d8;
  Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  undefined1 local_4c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  AssertHelper local_4a0;
  allocator_type local_498;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_490;
  
  local_498.id_ = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::parallel_hash_set(&local_490,0x7b,&local_498);
  local_4d0.id_ =
       (size_t)local_490.sets_._M_elems[0].set_.settings_.
               super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               .
               super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               .
               super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               .
               super__Tuple_impl<3UL,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               .
               super__Head_base<3UL,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_false>
               ._M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
            ((internal *)local_4c0,"m.get_allocator()","alloc",&local_4d0,&local_498);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d0);
    if (local_4b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_4b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    if ((long *)local_4d0.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_4d0.id_ + 8))();
    }
  }
  if (local_4b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,local_4b8);
  }
  lVar2 = 0x10;
  lVar1 = 0;
  do {
    lVar1 = lVar1 + *(long *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar2);
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x490);
  local_4d0.id_._0_1_ = lVar1 == 0;
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (lVar1 != 0) {
    testing::Message::Message((Message *)&local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_4c0,(internal *)&local_4d0,(AssertionResult *)"m.empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x79,(char *)CONCAT71(local_4c0._1_7_,local_4c0[0]));
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_4c0._1_7_,local_4c0[0]) != &local_4b0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_4c0._1_7_,local_4c0[0]),local_4b0._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_4d8.data_._4_4_,local_4d8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4d8.data_._4_4_,local_4d8.data_._0_4_) + 8))();
    }
  }
  if (local_4c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4c8,local_4c8);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_4c0,(char *)&local_4d0,
             (parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
              *)0x2e0715);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d0);
    if (local_4b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_4b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    if ((long *)local_4d0.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_4d0.id_ + 8))();
    }
  }
  if (local_4b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,local_4b8);
  }
  lVar1 = 0x18;
  local_4d0.id_ = 0;
  do {
    local_4d0.id_ = local_4d0.id_ + *(long *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar1)
    ;
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x498);
  local_4d8.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_4c0,"m.bucket_count()","123",&local_4d0.id_,(int *)&local_4d8);
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d0);
    if (local_4b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_4b8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    if ((long *)local_4d0.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_4d0.id_ + 8))();
    }
  }
  if (local_4b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,local_4b8);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~parallel_hash_set(&local_490);
  return;
}

Assistant:

void BucketCountAllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(m, ::testing::UnorderedElementsAre());
  EXPECT_GE(m.bucket_count(), 123);
}